

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O3

bool __thiscall Clasp::LoopFormula::otherIsSat(LoopFormula *this,Solver *s)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  
  uVar1 = this->other_;
  uVar8 = *(uint *)&this->field_0x10 >> 0x1f;
  uVar2 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)uVar1 * 4);
  puVar3 = (s->assign_).assign_.ebo_.buf;
  bVar6 = (byte)*(undefined4 *)((long)puVar3 + (ulong)(uVar2 & 0xfffffffc)) & 3;
  bVar7 = 2 - ((uVar2 & 2) == 0);
  bVar4 = bVar6 == bVar7 && uVar1 != uVar8;
  if ((uVar1 == uVar8) && (bVar6 == bVar7)) {
    lVar5 = (ulong)this->end_ << 2;
    do {
      if ((ulong)(*(uint *)&this->field_0x10 << 2) - 4 == lVar5) {
        return true;
      }
      uVar8 = *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + lVar5 + 4);
      lVar5 = lVar5 + 4;
    } while ((byte)(*(byte *)((long)puVar3 + (ulong)(uVar8 & 0xfffffffc)) & 3) ==
             (byte)(2U - ((uVar8 & 2) == 0)));
    *(uint *)((long)&this[1].super_Constraint._vptr_Constraint + (ulong)uVar1 * 4) =
         uVar8 | uVar2 & 1;
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool LoopFormula::otherIsSat(const Solver& s) {
	if (other_ != xPos_)          { return s.isTrue(lits_[other_]); }
	if (!s.isTrue(lits_[other_])) { return false; }
	for (Literal* it = xBegin(), *end = xEnd(); it != end; ++it) {
		if (!s.isTrue(*it)) {
			if (lits_[xPos_].flagged()){ (lits_[xPos_] = *it).flag(); }
			else                       { lits_[xPos_] = *it; }
			return false;
		}
	}
	return true;
}